

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O1

bool clusterDBSCAN(TSimilarityMap *sim,TValueCC epsCC,int minPts,TKeyPressCollection *keyPresses)

{
  pointer psVar1;
  undefined1 auVar2 [16];
  int iVar3;
  TClusterId *pTVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  vector<int,_std::allocator<int>_> nbi;
  vector<int,_std::allocator<int>_> nbq;
  int local_a0;
  int local_9c;
  void *local_98;
  iterator iStack_90;
  int *local_88;
  TKeyPressCollection *local_78;
  int local_6c;
  void *local_68;
  iterator iStack_60;
  int *local_58;
  TClusterId *local_48;
  TValueCC local_40;
  ulong local_38;
  
  auVar2 = _DAT_00115030;
  psVar1 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar7 = (int)((long)(keyPresses->
                      super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                      super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) * -0x55555555;
  if (0 < (int)uVar7) {
    uVar5 = (ulong)(uVar7 + 3 & 0xfffffffc);
    lVar6 = (ulong)(uVar7 & 0x7fffffff) - 1;
    auVar8._8_4_ = (int)lVar6;
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = (int)((ulong)lVar6 >> 0x20);
    pTVar4 = &psVar1[3].cid;
    auVar8 = auVar8 ^ _DAT_00115030;
    auVar9 = _DAT_00115010;
    auVar10 = _DAT_00115020;
    do {
      auVar11 = auVar10 ^ auVar2;
      iVar3 = auVar8._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar3 && auVar8._0_4_ < auVar11._0_4_ || iVar3 < auVar11._4_4_)
                & 1)) {
        pTVar4[-0x24] = 0xffffffff;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        pTVar4[-0x18] = 0xffffffff;
      }
      auVar11 = auVar9 ^ auVar2;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar3 && (iVar12 != iVar3 || auVar11._0_4_ <= auVar8._0_4_)) {
        pTVar4[-0xc] = 0xffffffff;
        *pTVar4 = -1;
      }
      lVar6 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar6 + 4;
      lVar6 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 4;
      auVar9._8_8_ = lVar6 + 4;
      pTVar4 = pTVar4 + 0x30;
      uVar5 = uVar5 - 4;
    } while (uVar5 != 0);
  }
  if (0 < (int)uVar7) {
    local_38 = (ulong)(uVar7 & 0x7fffffff);
    uVar5 = 0;
    local_a0 = 0;
    local_78 = keyPresses;
    local_6c = minPts;
    local_40 = epsCC;
    do {
      psVar1 = (keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (psVar1[uVar5].cid == -1) {
        local_48 = &psVar1[uVar5].cid;
        local_98 = (void *)0x0;
        iStack_90._M_current = (int *)0x0;
        local_88 = (int *)0x0;
        local_68 = (void *)((ulong)local_68 & 0xffffffff00000000);
        iVar3 = 0;
        do {
          if (local_40 <
              *(double *)
               (*(long *)&(sim->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar5].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data + (long)iVar3 * 0x10)) {
            if (iStack_90._M_current == local_88) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_98,iStack_90,(int *)&local_68);
            }
            else {
              *iStack_90._M_current = iVar3;
              iStack_90._M_current = iStack_90._M_current + 1;
            }
          }
          iVar3 = (int)local_68 + 1;
          local_68 = (void *)CONCAT44(local_68._4_4_,iVar3);
        } while (iVar3 < (int)uVar7);
        keyPresses = local_78;
        if ((int)((ulong)((long)iStack_90._M_current - (long)local_98) >> 2) < local_6c) {
          *local_48 = 0;
        }
        else {
          local_a0 = local_a0 + 1;
          *local_48 = local_a0;
          if (0 < (int)((ulong)((long)iStack_90._M_current - (long)local_98) >> 2)) {
            lVar6 = 0;
            do {
              pTVar4 = &(keyPresses->
                        super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ).
                        super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start
                        [*(int *)((long)local_98 + lVar6 * 4)].cid;
              if (*pTVar4 == 0) {
                *pTVar4 = local_a0;
              }
              if (*pTVar4 == -1) {
                *pTVar4 = local_a0;
                local_68 = (void *)0x0;
                iStack_60._M_current = (int *)0x0;
                local_58 = (int *)0x0;
                local_9c = 0;
                do {
                  if (local_40 <
                      *(double *)
                       (*(long *)&(sim->
                                  super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start
                                  [*(int *)((long)local_98 + lVar6 * 4)].
                                  super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                                  super__Vector_impl_data + (long)local_9c * 0x10)) {
                    if (iStack_60._M_current == local_58) {
                      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                ((vector<int,std::allocator<int>> *)&local_68,iStack_60,&local_9c);
                    }
                    else {
                      *iStack_60._M_current = local_9c;
                      iStack_60._M_current = iStack_60._M_current + 1;
                    }
                  }
                  local_9c = local_9c + 1;
                } while (local_9c < (int)uVar7);
                if (local_6c <= (int)((ulong)((long)iStack_60._M_current - (long)local_68) >> 2)) {
                  std::vector<int,std::allocator<int>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                            ((vector<int,std::allocator<int>> *)&local_98,iStack_90._M_current);
                }
                keyPresses = local_78;
                if (local_68 != (void *)0x0) {
                  operator_delete(local_68,(long)local_58 - (long)local_68);
                  keyPresses = local_78;
                }
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < (int)((ulong)((long)iStack_90._M_current - (long)local_98) >> 2));
          }
        }
        if (local_98 != (void *)0x0) {
          operator_delete(local_98,(long)local_88 - (long)local_98);
          keyPresses = local_78;
        }
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != local_38);
  }
  return true;
}

Assistant:

bool clusterDBSCAN(const TSimilarityMap & sim, TValueCC epsCC, int minPts, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = -1;
    }

    int curId = 0;

    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        if (cid != -1) continue;
        std::vector<int> nbi;
        for (int j = 0; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            if (cc > epsCC) nbi.push_back(j);
        }

        if ((int) nbi.size() < minPts) {
            cid = 0;
            continue;
        }

        cid = ++curId;
        for (int q = 0; q < (int) nbi.size(); ++q) {
            auto & qcid = keyPresses[nbi[q]].cid;

            if (qcid == 0) qcid = curId;
            if (qcid != -1) continue;
            qcid = curId;

            std::vector<int> nbq;
            for (int j = 0; j < n; ++j) {
                auto & cc = sim[nbi[q]][j].cc;

                if (cc > epsCC) nbq.push_back(j);
            }

            if ((int) nbq.size() >= minPts) {
                nbi.insert(nbi.end(), nbq.begin(), nbq.end());
            }
        }
    }

    return true;
}